

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

void __thiscall AActor::VelFromAngle(AActor *this,DAngle *angle,double speed)

{
  double dVar1;
  double speed_local;
  DAngle *angle_local;
  AActor *this_local;
  
  dVar1 = TAngle<double>::Cos(angle);
  (this->Vel).X = speed * dVar1;
  dVar1 = TAngle<double>::Sin(angle);
  (this->Vel).Y = speed * dVar1;
  return;
}

Assistant:

void VelFromAngle(DAngle angle, double speed)
	{
		Vel.X = speed * angle.Cos();
		Vel.Y = speed * angle.Sin();
	}